

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

char * get_token_lexeme(VrplibParser *p)

{
  char *__src;
  _Bool _Var1;
  ushort **ppuVar2;
  size_t __n;
  bool bVar3;
  char *lexeme;
  intptr_t toksize;
  char *at;
  VrplibParser *p_local;
  
  parser_eat_whitespaces(p);
  __src = p->at;
  while( true ) {
    _Var1 = parser_is_eof(p);
    bVar3 = false;
    if ((((!_Var1) && (bVar3 = true, *p->at != '-')) && (bVar3 = true, *p->at != '+')) &&
       (bVar3 = true, *p->at != '.')) {
      ppuVar2 = __ctype_b_loc();
      bVar3 = ((*ppuVar2)[(int)*p->at] & 8) != 0;
    }
    if (!bVar3) break;
    parser_adv(p,1);
  }
  __n = (long)p->at - (long)__src;
  if (__n == 0) {
    parser_eat_whitespaces(p);
    p_local = (VrplibParser *)0x0;
  }
  else {
    p_local = (VrplibParser *)malloc(__n + 1);
    if (p_local == (VrplibParser *)0x0) {
      log_log(0x80,
              "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
              ,0x1a0,"Failed memory allocation");
      p_local = (VrplibParser *)0x0;
    }
    else {
      strncpy((char *)p_local,__src,__n);
      *(char *)((long)p_local + __n) = '\0';
      parser_eat_whitespaces(p);
    }
  }
  return (char *)p_local;
}

Assistant:

static char *get_token_lexeme(VrplibParser *p) {
    parser_eat_whitespaces(p);
    char *at = p->at;

    while (!parser_is_eof(p) && (*p->at == '-' || *p->at == '+' ||
                                 *p->at == '.' || isalnum(*p->at))) {
        parser_adv(p, 1);
    }

    intptr_t toksize = p->at - at;

    if (toksize != 0) {
        char *lexeme = malloc(toksize + 1);
        if (!lexeme) {
            log_fatal("Failed memory allocation");
            return NULL;
        }

        strncpy(lexeme, at, toksize);
        lexeme[toksize] = '\0';
        parser_eat_whitespaces(p);
        return lexeme;
    }

    parser_eat_whitespaces(p);
    return NULL;
}